

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_line_base.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
assert_line_base<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>::
assert_line_base(assert_line_base<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                 *this,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  char_type cVar1;
  char_type cVar2;
  ctype<char> cVar3;
  char_class_type cVar4;
  size_t j;
  long lVar5;
  ctype<char> *pcVar6;
  char_type name [8];
  char local_28 [8];
  
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  lVar5 = 0;
  do {
    cVar1 = cpp_regex_traits<char>::widen(&tr->super_cpp_regex_traits<char>,"newline"[lVar5]);
    local_28[lVar5] = cVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 7);
  cVar4 = cpp_regex_traits<char>::lookup_classname<char*>
                    (&tr->super_cpp_regex_traits<char>,local_28,local_28 + 7,false);
  this->newline_ = cVar4;
  pcVar6 = (tr->super_cpp_regex_traits<char>).ctype_;
  if (pcVar6[0x38] == (ctype<char>)0x0) {
    std::ctype<char>::_M_widen_init();
    cVar2 = (**(code **)(*(long *)pcVar6 + 0x30))(pcVar6,10);
    pcVar6 = (tr->super_cpp_regex_traits<char>).ctype_;
    cVar3 = pcVar6[0x38];
    this->nl_ = cVar2;
    if (cVar3 == (ctype<char>)0x0) {
      std::ctype<char>::_M_widen_init();
      cVar3 = (ctype<char>)(**(code **)(*(long *)pcVar6 + 0x30))(pcVar6,0xd);
      goto LAB_00131429;
    }
  }
  else {
    this->nl_ = (char_type)pcVar6[0x43];
  }
  cVar3 = pcVar6[0x46];
LAB_00131429:
  this->cr_ = (char_type)cVar3;
  return;
}

Assistant:

assert_line_base(Traits const &tr)
            : newline_(lookup_classname(tr, "newline"))
            , nl_(tr.widen('\n'))
            , cr_(tr.widen('\r'))
        {
        }